

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManPrintClasses_old(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  int i;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    return;
  }
  i = 0;
  pGVar4 = p;
  while( true ) {
    iVar1 = (int)pGVar4;
    if (p->nRegs <= i) break;
    iVar1 = Vec_IntEntry(p->vCis,(p->vCis->nSize - p->nRegs) + i);
    pGVar4 = p;
    pGVar3 = Gia_ManObj(p,iVar1);
    iVar1 = (int)pGVar4;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar4 = (Gia_Man_t *)p->vFlopClasses;
    uVar2 = Vec_IntEntry((Vec_Int_t *)pGVar4,i);
    Abc_Print((int)pGVar4,"%d",(ulong)uVar2);
    i = i + 1;
  }
  Abc_Print(iVar1,"\n");
  pGVar4 = Gia_ManDupFlopClass(p,1);
  Gia_AigerWrite(pGVar4,"dom1.aig",0,0);
  Gia_ManStop(pGVar4);
  pGVar4 = Gia_ManDupFlopClass(p,2);
  Gia_AigerWrite(pGVar4,"dom2.aig",0,0);
  Gia_ManStop(pGVar4);
  return;
}

Assistant:

void Gia_ManPrintClasses_old( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses == NULL )
        return;
    Gia_ManForEachRo( p, pObj, i )
        Abc_Print( 1, "%d", Vec_IntEntry(p->vFlopClasses, i) );
    Abc_Print( 1, "\n" );

    {
        Gia_Man_t * pTemp;
        pTemp = Gia_ManDupFlopClass( p, 1 );
        Gia_AigerWrite( pTemp, "dom1.aig", 0, 0 );
        Gia_ManStop( pTemp );
        pTemp = Gia_ManDupFlopClass( p, 2 );
        Gia_AigerWrite( pTemp, "dom2.aig", 0, 0 );
        Gia_ManStop( pTemp );
    }
}